

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLogLog>
               (GetterXsYs<unsigned_long_long> *getter1,GetterXsYRef<unsigned_long_long> *getter2,
               TransformerLogLog *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  int iVar8;
  ImPlotPlot *pIVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterXsYRef<unsigned_long_long> *local_50;
  TransformerLogLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar12 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLogLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar16 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar16 = getter1->Count;
    }
    if (0 < iVar16) {
      iVar17 = 0;
      do {
        pIVar13 = GImPlot;
        iVar8 = getter1->Count;
        lVar15 = (long)(((getter1->Offset + iVar17) % iVar8 + iVar8) % iVar8) *
                 (long)getter1->Stride;
        uVar2 = *(unsigned_long_long *)((long)getter1->Xs + lVar15);
        auVar22._8_4_ = (int)(uVar2 >> 0x20);
        auVar22._0_8_ = uVar2;
        auVar22._12_4_ = 0x45300000;
        uVar3 = *(unsigned_long_long *)((long)getter1->Ys + lVar15);
        auVar20._8_4_ = (int)(uVar3 >> 0x20);
        auVar20._0_8_ = uVar3;
        auVar20._12_4_ = 0x45300000;
        dVar10 = log10(((auVar22._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar9 = pIVar13->CurrentPlot;
        dVar4 = pIVar13->LogDenX;
        dVar5 = (pIVar9->XAxis).Range.Min;
        dVar6 = (pIVar9->XAxis).Range.Max;
        dVar11 = log10(((auVar20._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                       pIVar9->YAxis[transformer->YAxis].Range.Min);
        pIVar14 = GImPlot;
        iVar8 = transformer->YAxis;
        pIVar9 = pIVar13->CurrentPlot;
        auVar26._8_8_ = pIVar13->LogDenY[iVar8];
        auVar26._0_8_ = dVar4;
        auVar21._8_8_ = dVar11;
        auVar21._0_8_ = dVar10;
        auVar22 = divpd(auVar21,auVar26);
        dVar4 = pIVar9->YAxis[iVar8].Range.Min;
        IVar7 = pIVar13->PixelRange[iVar8].Min;
        local_58._4_4_ =
             (float)(pIVar13->My[iVar8] *
                     (((double)(float)auVar22._8_8_ * (pIVar9->YAxis[iVar8].Range.Max - dVar4) +
                      dVar4) - dVar4) + (double)IVar7.y);
        local_58._0_4_ =
             (float)(pIVar13->Mx *
                     (((double)(float)auVar22._0_8_ * (dVar6 - dVar5) + dVar5) -
                     (pIVar9->XAxis).Range.Min) + (double)IVar7.x);
        iVar8 = getter2->Count;
        uVar2 = *(unsigned_long_long *)
                 ((long)getter2->Xs +
                 (long)(((getter2->Offset + iVar17) % iVar8 + iVar8) % iVar8) *
                 (long)getter2->Stride);
        auVar23._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
        auVar23._8_4_ = (int)(uVar2 >> 0x20);
        auVar23._12_4_ = 0x45300000;
        dVar4 = getter2->YRef;
        dVar11 = log10(((auVar23._8_8_ - 1.9342813113834067e+25) +
                       (auVar23._0_8_ - 4503599627370496.0)) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar9 = pIVar14->CurrentPlot;
        dVar5 = pIVar14->LogDenX;
        dVar6 = (pIVar9->XAxis).Range.Min;
        dVar10 = (pIVar9->XAxis).Range.Max;
        dVar4 = log10(dVar4 / pIVar9->YAxis[transformer->YAxis].Range.Min);
        iVar8 = transformer->YAxis;
        pIVar9 = pIVar14->CurrentPlot;
        auVar24._8_8_ = dVar4;
        auVar24._0_8_ = dVar11;
        auVar27._8_8_ = pIVar14->LogDenY[iVar8];
        auVar27._0_8_ = dVar5;
        auVar22 = divpd(auVar24,auVar27);
        dVar4 = pIVar9->YAxis[iVar8].Range.Min;
        IVar7 = pIVar14->PixelRange[iVar8].Min;
        fVar18 = (float)(pIVar14->Mx *
                         (((double)(float)auVar22._0_8_ * (dVar10 - dVar6) + dVar6) -
                         (pIVar9->XAxis).Range.Min) + (double)IVar7.x);
        fVar19 = (float)(pIVar14->My[iVar8] *
                         (((double)(float)auVar22._8_8_ * (pIVar9->YAxis[iVar8].Range.Max - dVar4) +
                          dVar4) - dVar4) + (double)IVar7.y);
        local_60.y = fVar19;
        local_60.x = fVar18;
        pIVar9 = pIVar12->CurrentPlot;
        fVar25 = (float)local_58._4_4_;
        if (fVar19 <= (float)local_58._4_4_) {
          fVar25 = fVar19;
        }
        if ((fVar25 < (pIVar9->PlotRect).Max.y) &&
           (fVar25 = (float)(~-(uint)(fVar19 <= (float)local_58._4_4_) & (uint)fVar19 |
                            local_58._4_4_ & -(uint)(fVar19 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar9->PlotRect).Min.y, *pfVar1 <= fVar25 && fVar25 != *pfVar1)) {
          fVar25 = (float)local_58._0_4_;
          if (fVar18 <= (float)local_58._0_4_) {
            fVar25 = fVar18;
          }
          if ((fVar25 < (pIVar9->PlotRect).Max.x) &&
             (fVar25 = (float)(-(uint)(fVar18 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar18 <= (float)local_58._0_4_) & (uint)fVar18),
             (pIVar9->PlotRect).Min.x <= fVar25 && fVar25 != (pIVar9->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar17 = iVar17 + 1;
      } while (iVar16 != iVar17);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}